

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O0

void __thiscall
Assimp::X3DExporter::AttrHelper_FloatToAttrList
          (X3DExporter *this,
          list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
          *pList,string *pName,float pValue,float pDefaultValue)

{
  value_type local_a0;
  undefined4 local_4c;
  undefined1 local_48 [8];
  string tstr;
  float pDefaultValue_local;
  float pValue_local;
  string *pName_local;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  *pList_local;
  X3DExporter *this_local;
  
  tstr.field_2._8_4_ = pDefaultValue;
  tstr.field_2._12_4_ = pValue;
  std::__cxx11::string::string((string *)local_48);
  if (((float)tstr.field_2._12_4_ != (float)tstr.field_2._8_4_) ||
     (NAN((float)tstr.field_2._12_4_) || NAN((float)tstr.field_2._8_4_))) {
    AttrHelper_FloatToString(this,(float)tstr.field_2._12_4_,(string *)local_48);
    std::__cxx11::string::string((string *)&local_a0,(string *)pName);
    std::__cxx11::string::string((string *)&local_a0.Value,(string *)local_48);
    std::__cxx11::
    list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    push_back(pList,&local_a0);
    SAttribute::~SAttribute(&local_a0);
    local_4c = 0;
  }
  else {
    local_4c = 1;
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void X3DExporter::AttrHelper_FloatToAttrList(std::list<SAttribute>& pList, const string& pName, const float pValue, const float pDefaultValue)
{
string tstr;

	if(pValue == pDefaultValue) return;

	AttrHelper_FloatToString(pValue, tstr);
	pList.push_back({pName, tstr});
}